

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O3

bool __thiscall cmCommandArgument::MayFollow(cmCommandArgument *this,cmCommandArgument *current)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  bool bVar5;
  
  bVar5 = true;
  if (this->ArgumentsBeforeEmpty == false) {
    p_Var2 = (this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &(this->ArgumentsBefore)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var4->_M_header;
    p_Var3 = &p_Var4->_M_header;
    if (p_Var2 != (_Base_ptr)0x0) {
      do {
        if (*(cmCommandArgument **)(p_Var2 + 1) >= current) {
          p_Var1 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(cmCommandArgument **)(p_Var2 + 1) < current];
      } while (p_Var2 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
         (p_Var3 = p_Var1, current < *(cmCommandArgument **)(p_Var1 + 1))) {
        p_Var3 = &p_Var4->_M_header;
      }
    }
    bVar5 = (_Rb_tree_header *)p_Var3 != p_Var4;
  }
  return bVar5;
}

Assistant:

bool cmCommandArgument::MayFollow(const cmCommandArgument* current) const
{
  if (this->ArgumentsBeforeEmpty) {
    return true;
  }
  return this->ArgumentsBefore.find(current) != this->ArgumentsBefore.end();
}